

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Task.cpp
# Opt level: O3

string * db_change_to_string_abi_cxx11_(string *__return_storage_ptr__,DbChangeType change)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(change) {
  case Insert:
    pcVar2 = "INSERT";
    pcVar1 = "";
    break;
  case Drop:
    pcVar2 = "DROP";
    pcVar1 = "";
    break;
  case Reload:
    pcVar2 = "RELOAD";
    pcVar1 = "";
    break;
  case ToggleTaint:
    pcVar2 = "TOGGLE_TAINT";
    pcVar1 = "";
    break;
  case NewIterator:
    pcVar2 = "NEW_ITERATOR";
    pcVar1 = "";
    break;
  case UpdateIterator:
    pcVar2 = "UPDATE_ITERATOR";
    pcVar1 = "";
    break;
  case ConfigChange:
    pcVar2 = "CONFIG_CHANGE";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "<invalid?>";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string db_change_to_string(DbChangeType change) {
    switch (change) {
        case DbChangeType::Insert:
            return "INSERT";
        case DbChangeType::Drop:
            return "DROP";
        case DbChangeType::Reload:
            return "RELOAD";
        case DbChangeType::ConfigChange:
            return "CONFIG_CHANGE";
        case DbChangeType::ToggleTaint:
            return "TOGGLE_TAINT";
        case DbChangeType::NewIterator:
            return "NEW_ITERATOR";
        case DbChangeType::UpdateIterator:
            return "UPDATE_ITERATOR";
    }
    return "<invalid?>";
}